

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O1

void __thiscall
AbstractTransaction_SetUnlockingScript_bytedata_Test::TestBody
          (AbstractTransaction_SetUnlockingScript_bytedata_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *message;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> bytedatas;
  AssertionResult gtest_ar;
  Transaction tx;
  Script local_170;
  string local_138;
  string local_118;
  internal local_f8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_e8 [48];
  Script local_b8;
  Transaction local_58;
  
  cfd::core::Transaction::Transaction(&local_58,2,3);
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"
             ,"");
  cfd::core::Txid::Txid((Txid *)&local_170,&local_118);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac","");
  cfd::core::Script::Script((Script *)local_e8,&local_138);
  cfd::core::Transaction::AddTxIn(&local_58,(Txid *)&local_170,0,0xffffffff,(Script *)local_e8);
  cfd::core::Script::~Script((Script *)local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_170._vptr_Script = (_func_int **)&PTR__Txid_007e3348;
  if (local_170.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity = 0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Transaction::SetUnlockingScript
              (&local_58,3,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_138);
  }
  testing::Message::Message((Message *)local_e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_170,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xb0,
             "Expected: tx.SetUnlockingScript(3, bytedatas) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
  if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(_func_int **)local_e8._0_8_ + 8))();
  }
  local_e8._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,"02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"
             ,"");
  cfd::core::ByteData::ByteData((ByteData *)&local_170,(string *)local_e8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
  emplace_back<cfd::core::ByteData>
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_138,
             (ByteData *)&local_170);
  if (local_170._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_170._vptr_Script,
                    (long)local_170.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_170._vptr_Script);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e8 + 0x10))
  {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::SetUnlockingScript
                (&local_58,0,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_138);
    }
  }
  else {
    testing::Message::Message((Message *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xb6,
               "Expected: tx.SetUnlockingScript(0, bytedatas) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_e8._0_8_ + 8))();
      }
      local_e8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)local_e8,&local_58,0);
  cfd::core::Script::Script(&local_170,&local_b8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_118,&local_170);
  testing::internal::CmpHelperSTREQ
            (local_f8,"tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str()",
             "\"2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\"",
             local_118._M_dataplus._M_p,
             "2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  cfd::core::Script::~Script(&local_170);
  cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_e8);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    if (local_f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xb9,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_e8._0_8_ + 8))();
      }
      local_e8._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_138);
  cfd::core::Transaction::~Transaction(&local_58);
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript_bytedata) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  std::vector<ByteData> bytedatas;
  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, bytedatas), CfdException);

  bytedatas.push_back(
      ByteData(
          "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"));

  EXPECT_NO_THROW(tx.SetUnlockingScript(0, bytedatas));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}